

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

png_fixed_point png_fixed(png_const_structrp png_ptr,double fp,png_const_charp text)

{
  double dVar1;
  
  dVar1 = floor(fp * 100000.0 + 0.5);
  if ((dVar1 <= 2147483647.0) && (-2147483648.0 <= dVar1)) {
    return (int)dVar1;
  }
  png_fixed_error(png_ptr,text);
}

Assistant:

png_fixed_point
png_fixed(png_const_structrp png_ptr, double fp, png_const_charp text)
{
   double r = floor(100000 * fp + .5);

   if (r > 2147483647. || r < -2147483648.)
      png_fixed_error(png_ptr, text);

#  ifndef PNG_ERROR_TEXT_SUPPORTED
   PNG_UNUSED(text)
#  endif

   return (png_fixed_point)r;
}